

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O2

void output_requires(string *section,string *version,
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *s)

{
  bool bVar1;
  _Base_ptr p_Var2;
  char *pcVar3;
  ostream *poVar4;
  string m2;
  char local_5a [2];
  string *local_58;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  long local_48;
  
  p_Var2 = (s->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar1 = true;
  local_58 = section;
  while ((_Rb_tree_header *)p_Var2 != &(s->_M_t)._M_impl.super__Rb_tree_header) {
    poVar4 = (ostream *)&std::cout;
    if (bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cout,(string *)local_58);
      pcVar3 = ": ";
    }
    else {
      pcVar3 = ", ";
    }
    std::operator<<(poVar4,pcVar3);
    std::__cxx11::string::string((string *)&local_50,(string *)(p_Var2 + 1));
    local_5a[1] = 0x7e;
    local_5a[0] = '_';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (local_50,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )(local_50._M_current + local_48),local_5a + 1,local_5a);
    poVar4 = std::operator<<((ostream *)&std::cout,"boost_");
    poVar4 = std::operator<<(poVar4,(string *)&local_50);
    poVar4 = std::operator<<(poVar4," = ");
    std::operator<<(poVar4,(string *)version);
    std::__cxx11::string::~string((string *)&local_50);
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    bVar1 = false;
  }
  return;
}

Assistant:

static void output_requires( std::string const & section, std::string const & version, std::set< std::string > const & s )
{
    bool first = true;

    for( std::set< std::string >::const_iterator i = s.begin(); i != s.end(); ++i )
    {
        if( first )
        {
            std::cout << section << ": ";
            first = false;
        }
        else
        {
            std::cout << ", ";
        }

        std::string m2( *i );
        std::replace( m2.begin(), m2.end(), '~', '_' );

        std::cout << "boost_" << m2 << " = " << version;
    }
}